

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.cc
# Opt level: O0

real __thiscall
fasttext::OneVsAllLoss::forward
          (OneVsAllLoss *this,vector<int,_std::allocator<int>_> *targets,int32_t param_3,
          State *state,real lr,bool backprop)

{
  real lr_00;
  int64_t iVar1;
  vector<int,_std::allocator<int>_> *in_RCX;
  undefined4 in_EDX;
  undefined1 in_R8B;
  undefined4 in_XMM0_Da;
  real rVar2;
  bool isMatch;
  int32_t i;
  int32_t osz;
  real loss;
  int iVar3;
  float fVar4;
  undefined3 in_stack_ffffffffffffffd8;
  uint uVar5;
  undefined4 in_stack_ffffffffffffffe8;
  
  uVar5 = CONCAT13(in_R8B,in_stack_ffffffffffffffd8) & 0x1ffffff;
  fVar4 = 0.0;
  iVar1 = Vector::size((Vector *)0x1cff98);
  lr_00 = (real)iVar1;
  for (iVar3 = 0; iVar3 < (int)lr_00; iVar3 = iVar3 + 1) {
    utils::contains<int>(in_RCX,(int *)CONCAT44(in_XMM0_Da,uVar5));
    rVar2 = BinaryLogisticLoss::binaryLogistic
                      ((BinaryLogisticLoss *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                       (int32_t)((ulong)in_RCX >> 0x20),(State *)CONCAT44(in_XMM0_Da,uVar5),
                       SUB41((uint)fVar4 >> 0x18,0),lr_00,SUB41((uint)iVar3 >> 0x18,0));
    fVar4 = rVar2 + fVar4;
  }
  return fVar4;
}

Assistant:

real OneVsAllLoss::forward(
    const std::vector<int32_t>& targets,
    int32_t /* we take all targets here */,
    Model::State& state,
    real lr,
    bool backprop) {
  real loss = 0.0;
  int32_t osz = state.output.size();
  for (int32_t i = 0; i < osz; i++) {
    bool isMatch = utils::contains(targets, i);
    loss += binaryLogistic(i, state, isMatch, lr, backprop);
  }

  return loss;
}